

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O2

bool __thiscall
Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::evaluateExpression
          (TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *this,
          QExpression *left,QExpression *right,QOperation oper)

{
  bool bVar1;
  QExpression *pQVar2;
  ulong uVar3;
  undefined7 in_register_00000009;
  
  switch((int)CONCAT71(in_register_00000009,oper)) {
  case 1:
    bVar1 = QExpression::operator>(left,0);
    if (!bVar1) {
      bVar1 = QExpression::operator>(right,0);
      goto LAB_00112175;
    }
    uVar3 = 1;
    goto LAB_00112178;
  case 2:
    pQVar2 = (QExpression *)0x0;
    bVar1 = QExpression::operator>(left,0);
    if (bVar1) {
      bVar1 = QExpression::operator>(right,0);
      pQVar2 = (QExpression *)(ulong)bVar1;
    }
    (left->field_0).SubExpressions.storage_ = pQVar2;
    goto LAB_0011217b;
  case 3:
    bVar1 = isEqual(this,left,right);
    if (!bVar1) {
      return false;
    }
    break;
  case 4:
    bVar1 = isEqual(this,left,right);
    if (!bVar1) {
      return false;
    }
    *(byte *)&left->field_0 = *(byte *)&left->field_0 ^ 1;
    break;
  case 5:
    bVar1 = QExpression::operator>=(left,right);
    goto LAB_00112175;
  case 6:
    bVar1 = QExpression::operator<=(left,right);
    goto LAB_00112175;
  case 7:
    bVar1 = QExpression::operator>(left,right);
    goto LAB_00112175;
  case 8:
    bVar1 = QExpression::operator<(left,right);
LAB_00112175:
    uVar3 = (ulong)bVar1;
LAB_00112178:
    *(ulong *)&left->field_0 = uVar3;
LAB_0011217b:
    left->Type = NaturalNumber;
    break;
  case 9:
    QExpression::operator|=(left,right);
    break;
  case 10:
    QExpression::operator&=(left,right);
    break;
  case 0xb:
    QExpression::operator+=(left,right);
    break;
  case 0xc:
    QExpression::operator-=(left,right);
    break;
  case 0xd:
    QExpression::operator*=(left,right);
    break;
  case 0xe:
    bVar1 = QExpression::operator!=(right,0);
    if (!bVar1) {
      return false;
    }
    QExpression::operator/=(left,right);
    break;
  case 0xf:
    pQVar2 = (QExpression *)QExpression::operator%(left,right);
    (left->field_0).SubExpressions.storage_ = pQVar2;
    left->Type = IntegerNumber;
    break;
  case 0x10:
    bVar1 = QExpression::operator^=(left,right);
    return bVar1;
  }
  return true;
}

Assistant:

bool evaluateExpression(QExpression &left, QExpression &right, const QOperation oper) const noexcept {
        switch (oper) {
            case QOperation::Exponent: { // ^
                return (left ^= right);
            }

            case QOperation::Remainder: { // %
                left.Value.Number.Integer = (left % right);
                left.Type                 = ExpressionType::IntegerNumber;
                break;
            }

            case QOperation::Multiplication: { // *
                left *= right;
                break;
            }

            case QOperation::Division: { // /
                if (right != 0ULL) {
                    left /= right;
                    break;
                }

                return false;
            }

            case QOperation::Addition: { // +
                left += right;
                break;
            }

            case QOperation::Subtraction: { // -
                left -= right;
                break;
            }

            case QOperation::BitwiseAnd: { // &
                left &= right;
                break;
            }

            case QOperation::BitwiseOr: { // |
                left |= right;
                break;
            }

            case QOperation::Less: { // <
                left.Value.Number.Natural = SizeT64(left < right);
                left.Type                 = ExpressionType::NaturalNumber;
                break;
            }

            case QOperation::LessOrEqual: { // <=
                left.Value.Number.Natural = SizeT64(left <= right);
                left.Type                 = ExpressionType::NaturalNumber;
                break;
            }

            case QOperation::Greater: { // >
                left.Value.Number.Natural = SizeT64(left > right);
                left.Type                 = ExpressionType::NaturalNumber;
                break;
            }

            case QOperation::GreaterOrEqual: { // >=
                left.Value.Number.Natural = SizeT64(left >= right);
                left.Type                 = ExpressionType::NaturalNumber;
                break;
            }

            case QOperation::And: { // &&
                left.Value.Number.Natural = SizeT64((left > 0U) && (right > 0U));
                left.Type                 = ExpressionType::NaturalNumber;
                break;
            }

            case QOperation::Or: { // ||
                left.Value.Number.Natural = SizeT64((left > 0U) || (right > 0U));
                left.Type                 = ExpressionType::NaturalNumber;
                break;
            }

            case QOperation::Equal: { // ==
                if (isEqual(left, right)) {
                    break;
                }

                return false;
            }

            case QOperation::NotEqual: { // !=
                if (isEqual(left, right)) {
                    left.Value.Number.Natural = (left.Value.Number.Natural ^ 1ULL);
                    break;
                }

                return false;
            }

            default: {
                // It will not reach this.
            }
        }

        return true;
    }